

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

BcOp relop_invert(BcOp relop)

{
  BcOp local_c;
  BcOp relop_local;
  
  switch(relop) {
  case BC_EQ_LL:
    local_c = BC_NEQ_LL;
    break;
  case BC_EQ_LN:
    local_c = BC_NEQ_LN;
    break;
  case BC_EQ_LP:
    local_c = BC_NEQ_LP;
    break;
  case BC_NEQ_LL:
    local_c = BC_EQ_LL;
    break;
  case BC_NEQ_LN:
    local_c = BC_EQ_LN;
    break;
  case BC_NEQ_LP:
    local_c = BC_EQ_LP;
    break;
  case BC_LT_LL:
    local_c = BC_GE_LL;
    break;
  case BC_LT_LN:
    local_c = BC_GE_LN;
    break;
  case BC_LE_LL:
    local_c = BC_GT_LL;
    break;
  case BC_LE_LN:
    local_c = BC_GT_LN;
    break;
  case BC_GT_LL:
    local_c = BC_LE_LL;
    break;
  case BC_GT_LN:
    local_c = BC_LE_LN;
    break;
  case BC_GE_LL:
    local_c = BC_LT_LL;
    break;
  case BC_GE_LN:
    local_c = BC_LT_LN;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x161,"BcOp relop_invert(BcOp)");
  }
  return local_c;
}

Assistant:

static BcOp relop_invert(BcOp relop) {
	switch (relop) {
		case BC_EQ_LL:  return BC_NEQ_LL;
		case BC_EQ_LN:  return BC_NEQ_LN;
		case BC_EQ_LP:  return BC_NEQ_LP;
		case BC_NEQ_LL: return BC_EQ_LL;
		case BC_NEQ_LN: return BC_EQ_LN;
		case BC_NEQ_LP: return BC_EQ_LP;
		case BC_LT_LL:  return BC_GE_LL;
		case BC_LT_LN:  return BC_GE_LN;
		case BC_LE_LL:  return BC_GT_LL;
		case BC_LE_LN:  return BC_GT_LN;
		case BC_GT_LL:  return BC_LE_LL;
		case BC_GT_LN:  return BC_LE_LN;
		case BC_GE_LL:  return BC_LT_LL;
		case BC_GE_LN:  return BC_LT_LN;
		default: UNREACHABLE();
	}
}